

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O0

void __thiscall gui::DefaultTheme::DefaultTheme(DefaultTheme *this,Gui *gui,Font *font)

{
  undefined8 *in_RDI;
  float fVar1;
  Font *in_stack_000001b8;
  Theme *in_stack_000001c0;
  Gui *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  __0 local_21;
  _func_void_Font_ptr *local_20;
  
  Theme::Theme((Theme *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98);
  *in_RDI = &PTR__DefaultTheme_002f66f8;
  local_20 = DefaultTheme(gui::Gui_const&,sf::Font&)::$_0::operator_cast_to_function_pointer
                       (&local_21);
  std::unique_ptr<sf::Font,void(*)(sf::Font*)>::unique_ptr<void(*)(sf::Font*),void>
            ((unique_ptr<sf::Font,_void_(*)(sf::Font_*)> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (pointer)in_stack_ffffffffffffff98,
             (__enable_if_t<_is_lvalue_reference<void_(*)(Font_*)>::value,_void_(*&&)(sf::Font_*)>)
             0x168d2c);
  std::unique_ptr<sf::Font,_void_(*)(sf::Font_*)>::operator*
            ((unique_ptr<sf::Font,_void_(*)(sf::Font_*)> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  fVar1 = Theme::computeTextMaxHeightRatio(in_stack_000001c0,in_stack_000001b8);
  *(float *)(in_RDI + 10) = fVar1;
  return;
}

Assistant:

DefaultTheme::DefaultTheme(const Gui& gui, sf::Font& font) :
    Theme(gui),
    font_(&font, [](sf::Font* /*ptr*/) { /* Do nothing.*/ }) {

    fontMaxHeightRatio_ = computeTextMaxHeightRatio(*font_);
}